

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.h
# Opt level: O0

void __thiscall
google::protobuf::TestUtil::ReflectionTester::ExpectAllFieldsSetViaReflection3
          (ReflectionTester *this,Message *message)

{
  bool bVar1;
  Reflection *this_00;
  FieldDescriptor *pFVar2;
  char *pcVar3;
  string *psVar4;
  char *in_R9;
  AssertHelper local_1120;
  Message local_1118;
  allocator<char> local_1109;
  string local_1108;
  undefined1 local_10e8 [8];
  AssertionResult gtest_ar_22;
  Message local_10d0;
  allocator<char> local_10c1;
  string local_10c0;
  string local_10a0;
  undefined1 local_1080 [8];
  AssertionResult gtest_ar_21;
  Message local_1068;
  allocator<char> local_1059;
  string local_1058;
  undefined1 local_1038 [8];
  AssertionResult gtest_ar_20;
  Message local_1020;
  allocator<char> local_1011;
  string local_1010;
  string local_ff0;
  undefined1 local_fd0 [8];
  AssertionResult gtest_ar_19;
  Message local_fb8;
  allocator<char> local_fa9;
  string local_fa8;
  EnumValueDescriptor *local_f88;
  undefined1 local_f80 [8];
  AssertionResult gtest_ar_18;
  Message local_f68;
  allocator<char> local_f59;
  string local_f58;
  EnumValueDescriptor *local_f38;
  undefined1 local_f30 [8];
  AssertionResult gtest_ar_17;
  Message local_f18;
  allocator<char> local_f09;
  string local_f08;
  EnumValueDescriptor *local_ee8;
  undefined1 local_ee0 [8];
  AssertionResult gtest_ar_16;
  Message local_ec8;
  allocator<char> local_eb9;
  string local_eb8;
  undefined1 local_e98 [8];
  AssertionResult gtest_ar_15;
  Message local_e80;
  allocator<char> local_e71;
  string local_e70;
  undefined1 local_e50 [8];
  AssertionResult gtest_ar_14;
  Message local_e38;
  allocator<char> local_e29;
  string local_e28;
  string local_e08;
  undefined1 local_de8 [8];
  AssertionResult gtest_ar_13;
  Message local_dd0;
  allocator<char> local_dc1;
  string local_dc0;
  string local_da0;
  undefined1 local_d80 [8];
  AssertionResult gtest_ar_12;
  AssertHelper local_d50;
  Message local_d48;
  allocator<char> local_d39;
  string local_d38;
  bool local_d11;
  undefined1 local_d10 [8];
  AssertionResult gtest_ar__20;
  Message local_cf8;
  allocator<char> local_ce9;
  string local_ce8;
  double local_cc8;
  int local_cbc;
  undefined1 local_cb8 [8];
  AssertionResult gtest_ar_11;
  Message local_ca0;
  allocator<char> local_c91;
  string local_c90;
  float local_c70;
  int local_c6c;
  undefined1 local_c68 [8];
  AssertionResult gtest_ar_10;
  Message local_c50;
  allocator<char> local_c41;
  string local_c40;
  int64_t local_c20;
  int local_c14;
  undefined1 local_c10 [8];
  AssertionResult gtest_ar_9;
  Message local_bf8;
  allocator<char> local_be9;
  string local_be8;
  int32_t local_bc8;
  int local_bc4;
  undefined1 local_bc0 [8];
  AssertionResult gtest_ar_8;
  Message local_ba8;
  allocator<char> local_b99;
  string local_b98;
  uint64_t local_b78;
  int local_b6c;
  undefined1 local_b68 [8];
  AssertionResult gtest_ar_7;
  Message local_b50;
  allocator<char> local_b41;
  string local_b40;
  uint32_t local_b20 [2];
  undefined1 local_b18 [8];
  AssertionResult gtest_ar_6;
  Message local_b00;
  allocator<char> local_af1;
  string local_af0;
  int64_t local_ad0;
  int local_ac4;
  undefined1 local_ac0 [8];
  AssertionResult gtest_ar_5;
  Message local_aa8;
  allocator<char> local_a99;
  string local_a98;
  int32_t local_a78;
  int local_a74;
  undefined1 local_a70 [8];
  AssertionResult gtest_ar_4;
  Message local_a58;
  allocator<char> local_a49;
  string local_a48;
  uint64_t local_a28;
  int local_a1c;
  undefined1 local_a18 [8];
  AssertionResult gtest_ar_3;
  Message local_a00;
  allocator<char> local_9f1;
  string local_9f0;
  uint32_t local_9d0 [2];
  undefined1 local_9c8 [8];
  AssertionResult gtest_ar_2;
  Message local_9b0;
  allocator<char> local_9a1;
  string local_9a0;
  int64_t local_980;
  int local_974;
  undefined1 local_970 [8];
  AssertionResult gtest_ar_1;
  Message local_958;
  allocator<char> local_949;
  string local_948;
  int32_t local_928;
  int local_924;
  undefined1 local_920 [8];
  AssertionResult gtest_ar;
  AssertHelper local_8f0;
  Message local_8e8;
  allocator<char> local_8d9;
  string local_8d8;
  bool local_8b1;
  undefined1 local_8b0 [8];
  AssertionResult gtest_ar__19;
  AssertHelper local_880;
  Message local_878;
  allocator<char> local_869;
  string local_868;
  bool local_841;
  undefined1 local_840 [8];
  AssertionResult gtest_ar__18;
  AssertHelper local_810;
  Message local_808;
  allocator<char> local_7f9;
  string local_7f8;
  bool local_7d1;
  undefined1 local_7d0 [8];
  AssertionResult gtest_ar__17;
  AssertHelper local_7a0;
  Message local_798;
  allocator<char> local_789;
  string local_788;
  bool local_761;
  undefined1 local_760 [8];
  AssertionResult gtest_ar__16;
  AssertHelper local_730;
  Message local_728;
  allocator<char> local_719;
  string local_718;
  bool local_6f1;
  undefined1 local_6f0 [8];
  AssertionResult gtest_ar__15;
  AssertHelper local_6c0;
  Message local_6b8;
  allocator<char> local_6a9;
  string local_6a8;
  bool local_681;
  undefined1 local_680 [8];
  AssertionResult gtest_ar__14;
  AssertHelper local_650;
  Message local_648;
  allocator<char> local_639;
  string local_638;
  bool local_611;
  undefined1 local_610 [8];
  AssertionResult gtest_ar__13;
  AssertHelper local_5e0;
  Message local_5d8;
  allocator<char> local_5c9;
  string local_5c8;
  bool local_5a1;
  undefined1 local_5a0 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_570;
  Message local_568;
  allocator<char> local_559;
  string local_558;
  bool local_531;
  undefined1 local_530 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_500;
  Message local_4f8;
  allocator<char> local_4e9;
  string local_4e8;
  bool local_4c1;
  undefined1 local_4c0 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_490;
  Message local_488;
  allocator<char> local_479;
  string local_478;
  bool local_451;
  undefined1 local_450 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_420;
  Message local_418;
  allocator<char> local_409;
  string local_408;
  bool local_3e1;
  undefined1 local_3e0 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_3b0;
  Message local_3a8;
  allocator<char> local_399;
  string local_398;
  bool local_371;
  undefined1 local_370 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_340;
  Message local_338;
  allocator<char> local_329;
  string local_328;
  bool local_301;
  undefined1 local_300 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_2d0;
  Message local_2c8;
  allocator<char> local_2b9;
  string local_2b8;
  bool local_291;
  undefined1 local_290 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_260;
  Message local_258;
  allocator<char> local_249;
  string local_248;
  bool local_221;
  undefined1 local_220 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_1f0;
  Message local_1e8;
  allocator<char> local_1d9;
  string local_1d8;
  bool local_1b1;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_180;
  Message local_178;
  allocator<char> local_169;
  string local_168;
  bool local_141;
  undefined1 local_140 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_110;
  Message local_108;
  allocator<char> local_f9;
  string local_f8;
  bool local_d1;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_a0;
  Message local_98 [3];
  allocator<char> local_79;
  string local_78;
  bool local_51;
  undefined1 local_50 [8];
  AssertionResult gtest_ar_;
  string scratch;
  Reflection *reflection;
  Message *message_local;
  ReflectionTester *this_local;
  
  this_00 = Message::GetReflection(message);
  std::__cxx11::string::string((string *)&gtest_ar_.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"default_int32",&local_79);
  pFVar2 = F(this,&local_78);
  local_51 = Reflection::HasField(this_00,message,pFVar2);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_50,&local_51,(type *)0x0)
  ;
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    testing::Message::Message(local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_50,
               (AssertionResult *)"reflection->HasField(message, F(\"default_int32\"))","false",
               "true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x2fa,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a0,local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"default_int64",&local_f9);
  pFVar2 = F(this,&local_f8);
  local_d1 = Reflection::HasField(this_00,message,pFVar2);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_d0,&local_d1,(type *)0x0)
  ;
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator(&local_f9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_d0,
               (AssertionResult *)"reflection->HasField(message, F(\"default_int64\"))","false",
               "true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x2fb,pcVar3);
    testing::internal::AssertHelper::operator=(&local_110,&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_168,"default_uint32",&local_169);
  pFVar2 = F(this,&local_168);
  local_141 = Reflection::HasField(this_00,message,pFVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_140,&local_141,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator(&local_169);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar1) {
    testing::Message::Message(&local_178);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_140,
               (AssertionResult *)"reflection->HasField(message, F(\"default_uint32\"))","false",
               "true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x2fc,pcVar3);
    testing::internal::AssertHelper::operator=(&local_180,&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,"default_uint64",&local_1d9);
  pFVar2 = F(this,&local_1d8);
  local_1b1 = Reflection::HasField(this_00,message,pFVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1b0,&local_1b1,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
  if (!bVar1) {
    testing::Message::Message(&local_1e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_1b0,
               (AssertionResult *)"reflection->HasField(message, F(\"default_uint64\"))","false",
               "true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x2fd,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper(&local_1f0);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_248,"default_sint32",&local_249);
  pFVar2 = F(this,&local_248);
  local_221 = Reflection::HasField(this_00,message,pFVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_220,&local_221,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator(&local_249);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
  if (!bVar1) {
    testing::Message::Message(&local_258);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_220,
               (AssertionResult *)"reflection->HasField(message, F(\"default_sint32\"))","false",
               "true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x2fe,pcVar3);
    testing::internal::AssertHelper::operator=(&local_260,&local_258);
    testing::internal::AssertHelper::~AssertHelper(&local_260);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b8,"default_sint64",&local_2b9);
  pFVar2 = F(this,&local_2b8);
  local_291 = Reflection::HasField(this_00,message,pFVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_290,&local_291,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::allocator<char>::~allocator(&local_2b9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_290);
  if (!bVar1) {
    testing::Message::Message(&local_2c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_290,
               (AssertionResult *)"reflection->HasField(message, F(\"default_sint64\"))","false",
               "true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x2ff,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2d0,&local_2c8);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_2c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_290);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"default_fixed32",&local_329);
  pFVar2 = F(this,&local_328);
  local_301 = Reflection::HasField(this_00,message,pFVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_300,&local_301,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_328);
  std::allocator<char>::~allocator(&local_329);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_300);
  if (!bVar1) {
    testing::Message::Message(&local_338);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__7.message_,(internal *)local_300,
               (AssertionResult *)"reflection->HasField(message, F(\"default_fixed32\"))","false",
               "true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_340,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x300,pcVar3);
    testing::internal::AssertHelper::operator=(&local_340,&local_338);
    testing::internal::AssertHelper::~AssertHelper(&local_340);
    std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
    testing::Message::~Message(&local_338);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_300);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_398,"default_fixed64",&local_399);
  pFVar2 = F(this,&local_398);
  local_371 = Reflection::HasField(this_00,message,pFVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_370,&local_371,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_398);
  std::allocator<char>::~allocator(&local_399);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_370);
  if (!bVar1) {
    testing::Message::Message(&local_3a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__8.message_,(internal *)local_370,
               (AssertionResult *)"reflection->HasField(message, F(\"default_fixed64\"))","false",
               "true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x301,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3b0,&local_3a8);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
    testing::Message::~Message(&local_3a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_408,"default_sfixed32",&local_409);
  pFVar2 = F(this,&local_408);
  local_3e1 = Reflection::HasField(this_00,message,pFVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3e0,&local_3e1,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_408);
  std::allocator<char>::~allocator(&local_409);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e0);
  if (!bVar1) {
    testing::Message::Message(&local_418);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__9.message_,(internal *)local_3e0,
               (AssertionResult *)"reflection->HasField(message, F(\"default_sfixed32\"))","false",
               "true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_420,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x302,pcVar3);
    testing::internal::AssertHelper::operator=(&local_420,&local_418);
    testing::internal::AssertHelper::~AssertHelper(&local_420);
    std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
    testing::Message::~Message(&local_418);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_478,"default_sfixed64",&local_479);
  pFVar2 = F(this,&local_478);
  local_451 = Reflection::HasField(this_00,message,pFVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_450,&local_451,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_478);
  std::allocator<char>::~allocator(&local_479);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_450);
  if (!bVar1) {
    testing::Message::Message(&local_488);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__10.message_,(internal *)local_450,
               (AssertionResult *)"reflection->HasField(message, F(\"default_sfixed64\"))","false",
               "true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_490,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x303,pcVar3);
    testing::internal::AssertHelper::operator=(&local_490,&local_488);
    testing::internal::AssertHelper::~AssertHelper(&local_490);
    std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
    testing::Message::~Message(&local_488);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_450);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4e8,"default_float",&local_4e9);
  pFVar2 = F(this,&local_4e8);
  local_4c1 = Reflection::HasField(this_00,message,pFVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4c0,&local_4c1,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::allocator<char>::~allocator(&local_4e9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4c0);
  if (!bVar1) {
    testing::Message::Message(&local_4f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__11.message_,(internal *)local_4c0,
               (AssertionResult *)"reflection->HasField(message, F(\"default_float\"))","false",
               "true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_500,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x304,pcVar3);
    testing::internal::AssertHelper::operator=(&local_500,&local_4f8);
    testing::internal::AssertHelper::~AssertHelper(&local_500);
    std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
    testing::Message::~Message(&local_4f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_558,"default_double",&local_559);
  pFVar2 = F(this,&local_558);
  local_531 = Reflection::HasField(this_00,message,pFVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_530,&local_531,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_558);
  std::allocator<char>::~allocator(&local_559);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_530);
  if (!bVar1) {
    testing::Message::Message(&local_568);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__12.message_,(internal *)local_530,
               (AssertionResult *)"reflection->HasField(message, F(\"default_double\"))","false",
               "true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_570,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x305,pcVar3);
    testing::internal::AssertHelper::operator=(&local_570,&local_568);
    testing::internal::AssertHelper::~AssertHelper(&local_570);
    std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
    testing::Message::~Message(&local_568);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_530);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5c8,"default_bool",&local_5c9)
  ;
  pFVar2 = F(this,&local_5c8);
  local_5a1 = Reflection::HasField(this_00,message,pFVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5a0,&local_5a1,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_5c8);
  std::allocator<char>::~allocator(&local_5c9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5a0);
  if (!bVar1) {
    testing::Message::Message(&local_5d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__13.message_,(internal *)local_5a0,
               (AssertionResult *)"reflection->HasField(message, F(\"default_bool\"))","false",
               "true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_5e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x306,pcVar3);
    testing::internal::AssertHelper::operator=(&local_5e0,&local_5d8);
    testing::internal::AssertHelper::~AssertHelper(&local_5e0);
    std::__cxx11::string::~string((string *)&gtest_ar__13.message_);
    testing::Message::~Message(&local_5d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_638,"default_string",&local_639);
  pFVar2 = F(this,&local_638);
  local_611 = Reflection::HasField(this_00,message,pFVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_610,&local_611,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_638);
  std::allocator<char>::~allocator(&local_639);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_610);
  if (!bVar1) {
    testing::Message::Message(&local_648);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__14.message_,(internal *)local_610,
               (AssertionResult *)"reflection->HasField(message, F(\"default_string\"))","false",
               "true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_650,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x307,pcVar3);
    testing::internal::AssertHelper::operator=(&local_650,&local_648);
    testing::internal::AssertHelper::~AssertHelper(&local_650);
    std::__cxx11::string::~string((string *)&gtest_ar__14.message_);
    testing::Message::~Message(&local_648);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_610);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6a8,"default_bytes",&local_6a9);
  pFVar2 = F(this,&local_6a8);
  local_681 = Reflection::HasField(this_00,message,pFVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_680,&local_681,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_6a8);
  std::allocator<char>::~allocator(&local_6a9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_680);
  if (!bVar1) {
    testing::Message::Message(&local_6b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__15.message_,(internal *)local_680,
               (AssertionResult *)"reflection->HasField(message, F(\"default_bytes\"))","false",
               "true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_6c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x308,pcVar3);
    testing::internal::AssertHelper::operator=(&local_6c0,&local_6b8);
    testing::internal::AssertHelper::~AssertHelper(&local_6c0);
    std::__cxx11::string::~string((string *)&gtest_ar__15.message_);
    testing::Message::~Message(&local_6b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_680);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_718,"default_nested_enum",&local_719);
  pFVar2 = F(this,&local_718);
  local_6f1 = Reflection::HasField(this_00,message,pFVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_6f0,&local_6f1,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_718);
  std::allocator<char>::~allocator(&local_719);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6f0);
  if (!bVar1) {
    testing::Message::Message(&local_728);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__16.message_,(internal *)local_6f0,
               (AssertionResult *)"reflection->HasField(message, F(\"default_nested_enum\"))",
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_730,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x30a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_730,&local_728);
    testing::internal::AssertHelper::~AssertHelper(&local_730);
    std::__cxx11::string::~string((string *)&gtest_ar__16.message_);
    testing::Message::~Message(&local_728);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_788,"default_foreign_enum",&local_789);
  pFVar2 = F(this,&local_788);
  local_761 = Reflection::HasField(this_00,message,pFVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_760,&local_761,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_788);
  std::allocator<char>::~allocator(&local_789);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_760);
  if (!bVar1) {
    testing::Message::Message(&local_798);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__17.message_,(internal *)local_760,
               (AssertionResult *)"reflection->HasField(message, F(\"default_foreign_enum\"))",
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_7a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x30b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_7a0,&local_798);
    testing::internal::AssertHelper::~AssertHelper(&local_7a0);
    std::__cxx11::string::~string((string *)&gtest_ar__17.message_);
    testing::Message::~Message(&local_798);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_760);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7f8,"default_import_enum",&local_7f9);
  pFVar2 = F(this,&local_7f8);
  local_7d1 = Reflection::HasField(this_00,message,pFVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_7d0,&local_7d1,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_7f8);
  std::allocator<char>::~allocator(&local_7f9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7d0);
  if (!bVar1) {
    testing::Message::Message(&local_808);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__18.message_,(internal *)local_7d0,
               (AssertionResult *)"reflection->HasField(message, F(\"default_import_enum\"))",
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_810,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x30c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_810,&local_808);
    testing::internal::AssertHelper::~AssertHelper(&local_810);
    std::__cxx11::string::~string((string *)&gtest_ar__18.message_);
    testing::Message::~Message(&local_808);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_868,"default_string_piece",&local_869);
  pFVar2 = F(this,&local_868);
  local_841 = Reflection::HasField(this_00,message,pFVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_840,&local_841,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_868);
  std::allocator<char>::~allocator(&local_869);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_840);
  if (!bVar1) {
    testing::Message::Message(&local_878);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__19.message_,(internal *)local_840,
               (AssertionResult *)"reflection->HasField(message, F(\"default_string_piece\"))",
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_880,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x30e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_880,&local_878);
    testing::internal::AssertHelper::~AssertHelper(&local_880);
    std::__cxx11::string::~string((string *)&gtest_ar__19.message_);
    testing::Message::~Message(&local_878);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_840);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8d8,"default_cord",&local_8d9)
  ;
  pFVar2 = F(this,&local_8d8);
  local_8b1 = Reflection::HasField(this_00,message,pFVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_8b0,&local_8b1,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_8d8);
  std::allocator<char>::~allocator(&local_8d9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8b0);
  if (!bVar1) {
    testing::Message::Message(&local_8e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_8b0,
               (AssertionResult *)"reflection->HasField(message, F(\"default_cord\"))","false",
               "true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_8f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x30f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_8f0,&local_8e8);
    testing::internal::AssertHelper::~AssertHelper(&local_8f0);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_8e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8b0);
  local_924 = 0x191;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_948,"default_int32",&local_949);
  pFVar2 = F(this,&local_948);
  local_928 = Reflection::GetInt32(this_00,message,pFVar2);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_920,"401","reflection->GetInt32(message, F(\"default_int32\"))",
             &local_924,&local_928);
  std::__cxx11::string::~string((string *)&local_948);
  std::allocator<char>::~allocator(&local_949);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_920);
  if (!bVar1) {
    testing::Message::Message(&local_958);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_920);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x311,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_958);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_958);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_920);
  local_974 = 0x192;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9a0,"default_int64",&local_9a1);
  pFVar2 = F(this,&local_9a0);
  local_980 = Reflection::GetInt64(this_00,message,pFVar2);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_970,"402","reflection->GetInt64(message, F(\"default_int64\"))",
             &local_974,&local_980);
  std::__cxx11::string::~string((string *)&local_9a0);
  std::allocator<char>::~allocator(&local_9a1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_970);
  if (!bVar1) {
    testing::Message::Message(&local_9b0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_970);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x312,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_9b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_9b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_970);
  local_9d0[1] = 0x193;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9f0,"default_uint32",&local_9f1);
  pFVar2 = F(this,&local_9f0);
  local_9d0[0] = Reflection::GetUInt32(this_00,message,pFVar2);
  testing::internal::EqHelper::Compare<int,_unsigned_int,_nullptr>
            ((EqHelper *)local_9c8,"403","reflection->GetUInt32(message, F(\"default_uint32\"))",
             (int *)(local_9d0 + 1),local_9d0);
  std::__cxx11::string::~string((string *)&local_9f0);
  std::allocator<char>::~allocator(&local_9f1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9c8);
  if (!bVar1) {
    testing::Message::Message(&local_a00);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_9c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x313,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_a00);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_a00);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9c8);
  local_a1c = 0x194;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a48,"default_uint64",&local_a49);
  pFVar2 = F(this,&local_a48);
  local_a28 = Reflection::GetUInt64(this_00,message,pFVar2);
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            ((EqHelper *)local_a18,"404","reflection->GetUInt64(message, F(\"default_uint64\"))",
             &local_a1c,&local_a28);
  std::__cxx11::string::~string((string *)&local_a48);
  std::allocator<char>::~allocator(&local_a49);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a18);
  if (!bVar1) {
    testing::Message::Message(&local_a58);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a18);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x314,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_a58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_a58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a18);
  local_a74 = 0x195;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a98,"default_sint32",&local_a99);
  pFVar2 = F(this,&local_a98);
  local_a78 = Reflection::GetInt32(this_00,message,pFVar2);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_a70,"405","reflection->GetInt32(message, F(\"default_sint32\"))",
             &local_a74,&local_a78);
  std::__cxx11::string::~string((string *)&local_a98);
  std::allocator<char>::~allocator(&local_a99);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a70);
  if (!bVar1) {
    testing::Message::Message(&local_aa8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a70);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x315,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_aa8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_aa8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a70);
  local_ac4 = 0x196;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_af0,"default_sint64",&local_af1);
  pFVar2 = F(this,&local_af0);
  local_ad0 = Reflection::GetInt64(this_00,message,pFVar2);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_ac0,"406","reflection->GetInt64(message, F(\"default_sint64\"))",
             &local_ac4,&local_ad0);
  std::__cxx11::string::~string((string *)&local_af0);
  std::allocator<char>::~allocator(&local_af1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ac0);
  if (!bVar1) {
    testing::Message::Message(&local_b00);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_ac0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x316,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_b00);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_b00);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ac0);
  local_b20[1] = 0x197;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b40,"default_fixed32",&local_b41);
  pFVar2 = F(this,&local_b40);
  local_b20[0] = Reflection::GetUInt32(this_00,message,pFVar2);
  testing::internal::EqHelper::Compare<int,_unsigned_int,_nullptr>
            ((EqHelper *)local_b18,"407","reflection->GetUInt32(message, F(\"default_fixed32\"))",
             (int *)(local_b20 + 1),local_b20);
  std::__cxx11::string::~string((string *)&local_b40);
  std::allocator<char>::~allocator(&local_b41);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b18);
  if (!bVar1) {
    testing::Message::Message(&local_b50);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_b18);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x317,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_b50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_b50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b18);
  local_b6c = 0x198;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b98,"default_fixed64",&local_b99);
  pFVar2 = F(this,&local_b98);
  local_b78 = Reflection::GetUInt64(this_00,message,pFVar2);
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            ((EqHelper *)local_b68,"408","reflection->GetUInt64(message, F(\"default_fixed64\"))",
             &local_b6c,&local_b78);
  std::__cxx11::string::~string((string *)&local_b98);
  std::allocator<char>::~allocator(&local_b99);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b68);
  if (!bVar1) {
    testing::Message::Message(&local_ba8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_b68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x318,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_ba8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_ba8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b68);
  local_bc4 = 0x199;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_be8,"default_sfixed32",&local_be9);
  pFVar2 = F(this,&local_be8);
  local_bc8 = Reflection::GetInt32(this_00,message,pFVar2);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_bc0,"409","reflection->GetInt32(message, F(\"default_sfixed32\"))",
             &local_bc4,&local_bc8);
  std::__cxx11::string::~string((string *)&local_be8);
  std::allocator<char>::~allocator(&local_be9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bc0);
  if (!bVar1) {
    testing::Message::Message(&local_bf8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_bc0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x319,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_bf8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_bf8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_bc0);
  local_c14 = 0x19a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c40,"default_sfixed64",&local_c41);
  pFVar2 = F(this,&local_c40);
  local_c20 = Reflection::GetInt64(this_00,message,pFVar2);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_c10,"410","reflection->GetInt64(message, F(\"default_sfixed64\"))",
             &local_c14,&local_c20);
  std::__cxx11::string::~string((string *)&local_c40);
  std::allocator<char>::~allocator(&local_c41);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c10);
  if (!bVar1) {
    testing::Message::Message(&local_c50);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_c10);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x31a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_c50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_c50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c10);
  local_c6c = 0x19b;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c90,"default_float",&local_c91);
  pFVar2 = F(this,&local_c90);
  local_c70 = Reflection::GetFloat(this_00,message,pFVar2);
  testing::internal::EqHelper::Compare<int,_float,_nullptr>
            ((EqHelper *)local_c68,"411","reflection->GetFloat(message, F(\"default_float\"))",
             &local_c6c,&local_c70);
  std::__cxx11::string::~string((string *)&local_c90);
  std::allocator<char>::~allocator(&local_c91);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c68);
  if (!bVar1) {
    testing::Message::Message(&local_ca0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_c68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x31b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_ca0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_ca0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c68);
  local_cbc = 0x19c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ce8,"default_double",&local_ce9);
  pFVar2 = F(this,&local_ce8);
  local_cc8 = Reflection::GetDouble(this_00,message,pFVar2);
  testing::internal::EqHelper::Compare<int,_double,_nullptr>
            ((EqHelper *)local_cb8,"412","reflection->GetDouble(message, F(\"default_double\"))",
             &local_cbc,&local_cc8);
  std::__cxx11::string::~string((string *)&local_ce8);
  std::allocator<char>::~allocator(&local_ce9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cb8);
  if (!bVar1) {
    testing::Message::Message(&local_cf8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_cb8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x31c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__20.message_,&local_cf8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__20.message_);
    testing::Message::~Message(&local_cf8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_cb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d38,"default_bool",&local_d39)
  ;
  pFVar2 = F(this,&local_d38);
  bVar1 = Reflection::GetBool(this_00,message,pFVar2);
  local_d11 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_d10,&local_d11,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_d38);
  std::allocator<char>::~allocator(&local_d39);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d10);
  if (!bVar1) {
    testing::Message::Message(&local_d48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_12.message_,(internal *)local_d10,
               (AssertionResult *)"reflection->GetBool(message, F(\"default_bool\"))","true","false"
               ,in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x31d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d50,&local_d48);
    testing::internal::AssertHelper::~AssertHelper(&local_d50);
    std::__cxx11::string::~string((string *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_d48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_dc0,"default_string",&local_dc1);
  pFVar2 = F(this,&local_dc0);
  Reflection::GetString_abi_cxx11_(&local_da0,this_00,message,pFVar2);
  testing::internal::EqHelper::
  Compare<char[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_d80,"\"415\"","reflection->GetString(message, F(\"default_string\"))"
             ,(char (*) [4])"415",&local_da0);
  std::__cxx11::string::~string((string *)&local_da0);
  std::__cxx11::string::~string((string *)&local_dc0);
  std::allocator<char>::~allocator(&local_dc1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d80);
  if (!bVar1) {
    testing::Message::Message(&local_dd0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_d80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x31e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_dd0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_dd0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e28,"default_bytes",&local_e29);
  pFVar2 = F(this,&local_e28);
  Reflection::GetString_abi_cxx11_(&local_e08,this_00,message,pFVar2);
  testing::internal::EqHelper::
  Compare<char[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_de8,"\"416\"","reflection->GetString(message, F(\"default_bytes\"))",
             (char (*) [4])0x1e0e5f2,&local_e08);
  std::__cxx11::string::~string((string *)&local_e08);
  std::__cxx11::string::~string((string *)&local_e28);
  std::allocator<char>::~allocator(&local_e29);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_de8);
  if (!bVar1) {
    testing::Message::Message(&local_e38);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_de8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,799,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_e38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_e38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_de8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e70,"default_string",&local_e71);
  pFVar2 = F(this,&local_e70);
  psVar4 = Reflection::GetStringReference(this_00,message,pFVar2,(string *)&gtest_ar_.message_);
  testing::internal::EqHelper::
  Compare<char[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_e50,"\"415\"",
             "reflection->GetStringReference(message, F(\"default_string\"), &scratch)",
             (char (*) [4])"415",psVar4);
  std::__cxx11::string::~string((string *)&local_e70);
  std::allocator<char>::~allocator(&local_e71);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e50);
  if (!bVar1) {
    testing::Message::Message(&local_e80);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_e50);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x322,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_e80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_e80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_eb8,"default_bytes",&local_eb9);
  pFVar2 = F(this,&local_eb8);
  psVar4 = Reflection::GetStringReference(this_00,message,pFVar2,(string *)&gtest_ar_.message_);
  testing::internal::EqHelper::
  Compare<char[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_e98,"\"416\"",
             "reflection->GetStringReference(message, F(\"default_bytes\"), &scratch)",
             (char (*) [4])0x1e0e5f2,psVar4);
  std::__cxx11::string::~string((string *)&local_eb8);
  std::allocator<char>::~allocator(&local_eb9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e98);
  if (!bVar1) {
    testing::Message::Message(&local_ec8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_e98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x324,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_ec8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_ec8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f08,"default_nested_enum",&local_f09);
  pFVar2 = F(this,&local_f08);
  local_ee8 = Reflection::GetEnum(this_00,message,pFVar2);
  testing::internal::EqHelper::
  Compare<const_google::protobuf::EnumValueDescriptor_*,_const_google::protobuf::EnumValueDescriptor_*,_nullptr>
            ((EqHelper *)local_ee0,"nested_foo_",
             "reflection->GetEnum(message, F(\"default_nested_enum\"))",&this->nested_foo_,
             &local_ee8);
  std::__cxx11::string::~string((string *)&local_f08);
  std::allocator<char>::~allocator(&local_f09);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ee0);
  if (!bVar1) {
    testing::Message::Message(&local_f18);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_ee0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x327,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_f18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_f18);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ee0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f58,"default_foreign_enum",&local_f59);
  pFVar2 = F(this,&local_f58);
  local_f38 = Reflection::GetEnum(this_00,message,pFVar2);
  testing::internal::EqHelper::
  Compare<const_google::protobuf::EnumValueDescriptor_*,_const_google::protobuf::EnumValueDescriptor_*,_nullptr>
            ((EqHelper *)local_f30,"foreign_foo_",
             "reflection->GetEnum(message, F(\"default_foreign_enum\"))",&this->foreign_foo_,
             &local_f38);
  std::__cxx11::string::~string((string *)&local_f58);
  std::allocator<char>::~allocator(&local_f59);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f30);
  if (!bVar1) {
    testing::Message::Message(&local_f68);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_f30);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x329,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,&local_f68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
    testing::Message::~Message(&local_f68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_fa8,"default_import_enum",&local_fa9);
  pFVar2 = F(this,&local_fa8);
  local_f88 = Reflection::GetEnum(this_00,message,pFVar2);
  testing::internal::EqHelper::
  Compare<const_google::protobuf::EnumValueDescriptor_*,_const_google::protobuf::EnumValueDescriptor_*,_nullptr>
            ((EqHelper *)local_f80,"import_foo_",
             "reflection->GetEnum(message, F(\"default_import_enum\"))",&this->import_foo_,
             &local_f88);
  std::__cxx11::string::~string((string *)&local_fa8);
  std::allocator<char>::~allocator(&local_fa9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f80);
  if (!bVar1) {
    testing::Message::Message(&local_fb8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_f80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x32b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_fb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(&local_fb8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1010,"default_string_piece",&local_1011);
  pFVar2 = F(this,&local_1010);
  Reflection::GetString_abi_cxx11_(&local_ff0,this_00,message,pFVar2);
  testing::internal::EqHelper::
  Compare<char[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_fd0,"\"424\"",
             "reflection->GetString(message, F(\"default_string_piece\"))",(char (*) [4])"424",
             &local_ff0);
  std::__cxx11::string::~string((string *)&local_ff0);
  std::__cxx11::string::~string((string *)&local_1010);
  std::allocator<char>::~allocator(&local_1011);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_fd0);
  if (!bVar1) {
    testing::Message::Message(&local_1020);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_fd0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x32d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,&local_1020);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
    testing::Message::~Message(&local_1020);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_fd0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1058,"default_string_piece",&local_1059);
  pFVar2 = F(this,&local_1058);
  psVar4 = Reflection::GetStringReference(this_00,message,pFVar2,(string *)&gtest_ar_.message_);
  testing::internal::EqHelper::
  Compare<char[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_1038,"\"424\"",
             "reflection->GetStringReference( message, F(\"default_string_piece\"), &scratch)",
             (char (*) [4])"424",psVar4);
  std::__cxx11::string::~string((string *)&local_1058);
  std::allocator<char>::~allocator(&local_1059);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1038);
  if (!bVar1) {
    testing::Message::Message(&local_1068);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1038);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x32f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,&local_1068);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
    testing::Message::~Message(&local_1068);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1038);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_10c0,"default_cord",&local_10c1);
  pFVar2 = F(this,&local_10c0);
  Reflection::GetString_abi_cxx11_(&local_10a0,this_00,message,pFVar2);
  testing::internal::EqHelper::
  Compare<char[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_1080,"\"425\"","reflection->GetString(message, F(\"default_cord\"))",
             (char (*) [4])"425",&local_10a0);
  std::__cxx11::string::~string((string *)&local_10a0);
  std::__cxx11::string::~string((string *)&local_10c0);
  std::allocator<char>::~allocator(&local_10c1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1080);
  if (!bVar1) {
    testing::Message::Message(&local_10d0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1080);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x331,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22.message_,&local_10d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
    testing::Message::~Message(&local_10d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1080);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1108,"default_cord",&local_1109);
  pFVar2 = F(this,&local_1108);
  psVar4 = Reflection::GetStringReference(this_00,message,pFVar2,(string *)&gtest_ar_.message_);
  testing::internal::EqHelper::
  Compare<char[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_10e8,"\"425\"",
             "reflection->GetStringReference(message, F(\"default_cord\"), &scratch)",
             (char (*) [4])"425",psVar4);
  std::__cxx11::string::~string((string *)&local_1108);
  std::allocator<char>::~allocator(&local_1109);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_10e8);
  if (!bVar1) {
    testing::Message::Message(&local_1118);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_10e8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x333,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1120,&local_1118);
    testing::internal::AssertHelper::~AssertHelper(&local_1120);
    testing::Message::~Message(&local_1118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_10e8);
  std::__cxx11::string::~string((string *)&gtest_ar_.message_);
  return;
}

Assistant:

inline void TestUtil::ReflectionTester::ExpectAllFieldsSetViaReflection3(
    const Message& message) {
  const Reflection* reflection = message.GetReflection();
  std::string scratch;

  // -----------------------------------------------------------------

  EXPECT_TRUE(reflection->HasField(message, F("default_int32")));
  EXPECT_TRUE(reflection->HasField(message, F("default_int64")));
  EXPECT_TRUE(reflection->HasField(message, F("default_uint32")));
  EXPECT_TRUE(reflection->HasField(message, F("default_uint64")));
  EXPECT_TRUE(reflection->HasField(message, F("default_sint32")));
  EXPECT_TRUE(reflection->HasField(message, F("default_sint64")));
  EXPECT_TRUE(reflection->HasField(message, F("default_fixed32")));
  EXPECT_TRUE(reflection->HasField(message, F("default_fixed64")));
  EXPECT_TRUE(reflection->HasField(message, F("default_sfixed32")));
  EXPECT_TRUE(reflection->HasField(message, F("default_sfixed64")));
  EXPECT_TRUE(reflection->HasField(message, F("default_float")));
  EXPECT_TRUE(reflection->HasField(message, F("default_double")));
  EXPECT_TRUE(reflection->HasField(message, F("default_bool")));
  EXPECT_TRUE(reflection->HasField(message, F("default_string")));
  EXPECT_TRUE(reflection->HasField(message, F("default_bytes")));

  EXPECT_TRUE(reflection->HasField(message, F("default_nested_enum")));
  EXPECT_TRUE(reflection->HasField(message, F("default_foreign_enum")));
  EXPECT_TRUE(reflection->HasField(message, F("default_import_enum")));

  EXPECT_TRUE(reflection->HasField(message, F("default_string_piece")));
  EXPECT_TRUE(reflection->HasField(message, F("default_cord")));

  EXPECT_EQ(401, reflection->GetInt32(message, F("default_int32")));
  EXPECT_EQ(402, reflection->GetInt64(message, F("default_int64")));
  EXPECT_EQ(403, reflection->GetUInt32(message, F("default_uint32")));
  EXPECT_EQ(404, reflection->GetUInt64(message, F("default_uint64")));
  EXPECT_EQ(405, reflection->GetInt32(message, F("default_sint32")));
  EXPECT_EQ(406, reflection->GetInt64(message, F("default_sint64")));
  EXPECT_EQ(407, reflection->GetUInt32(message, F("default_fixed32")));
  EXPECT_EQ(408, reflection->GetUInt64(message, F("default_fixed64")));
  EXPECT_EQ(409, reflection->GetInt32(message, F("default_sfixed32")));
  EXPECT_EQ(410, reflection->GetInt64(message, F("default_sfixed64")));
  EXPECT_EQ(411, reflection->GetFloat(message, F("default_float")));
  EXPECT_EQ(412, reflection->GetDouble(message, F("default_double")));
  EXPECT_FALSE(reflection->GetBool(message, F("default_bool")));
  EXPECT_EQ("415", reflection->GetString(message, F("default_string")));
  EXPECT_EQ("416", reflection->GetString(message, F("default_bytes")));

  EXPECT_EQ("415", reflection->GetStringReference(message, F("default_string"),
                                                  &scratch));
  EXPECT_EQ("416", reflection->GetStringReference(message, F("default_bytes"),
                                                  &scratch));

  EXPECT_EQ(nested_foo_,
            reflection->GetEnum(message, F("default_nested_enum")));
  EXPECT_EQ(foreign_foo_,
            reflection->GetEnum(message, F("default_foreign_enum")));
  EXPECT_EQ(import_foo_,
            reflection->GetEnum(message, F("default_import_enum")));

  EXPECT_EQ("424", reflection->GetString(message, F("default_string_piece")));
  EXPECT_EQ("424", reflection->GetStringReference(
                       message, F("default_string_piece"), &scratch));

  EXPECT_EQ("425", reflection->GetString(message, F("default_cord")));
  EXPECT_EQ("425", reflection->GetStringReference(message, F("default_cord"),
                                                  &scratch));
}